

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSpecification.cpp
# Opt level: O3

bool __thiscall
DIS::RecordSpecification::operator==(RecordSpecification *this,RecordSpecification *rhs)

{
  bool bVar1;
  bool bVar2;
  pointer pRVar3;
  ulong uVar4;
  long lVar5;
  
  pRVar3 = (this->_recordSets).
           super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_recordSets).
      super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
      ._M_impl.super__Vector_impl_data._M_finish == pRVar3) {
    bVar2 = true;
  }
  else {
    bVar2 = true;
    lVar5 = 0;
    uVar4 = 0;
    do {
      bVar1 = RecordSpecificationElement::operator==
                        ((RecordSpecificationElement *)
                         ((long)&pRVar3->_vptr_RecordSpecificationElement + lVar5),
                         (RecordSpecificationElement *)
                         ((long)&((rhs->_recordSets).
                                  super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                 _vptr_RecordSpecificationElement + lVar5));
      bVar2 = (bool)(bVar2 & bVar1);
      uVar4 = uVar4 + 1;
      pRVar3 = (this->_recordSets).
               super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x18;
    } while (uVar4 < (ulong)(((long)(this->_recordSets).
                                    super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3 >> 3)
                            * -0x5555555555555555));
  }
  return bVar2;
}

Assistant:

bool RecordSpecification::operator ==(const RecordSpecification& rhs) const
 {
     bool ivarsEqual = true;


     for(size_t idx = 0; idx < _recordSets.size(); idx++)
     {
        if( ! ( _recordSets[idx] == rhs._recordSets[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }